

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_BasicPartialEquivalencyNonSetTest_Test::
~MessageDifferencerTest_BasicPartialEquivalencyNonSetTest_Test
          (MessageDifferencerTest_BasicPartialEquivalencyNonSetTest_Test *this)

{
  MessageDifferencerTest_BasicPartialEquivalencyNonSetTest_Test *this_local;
  
  ~MessageDifferencerTest_BasicPartialEquivalencyNonSetTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageDifferencerTest, BasicPartialEquivalencyNonSetTest) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  // Compare
  util::MessageDifferencer differencer;
  differencer.set_message_field_comparison(
      util::MessageDifferencer::EQUIVALENT);
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}